

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string *name,Message *proto,FileDescriptor *file)

{
  Tables *this_00;
  Message *proto_00;
  bool bVar1;
  long lVar2;
  string *name_00;
  const_iterator cVar3;
  long *plVar4;
  FileDescriptor *pFVar5;
  long *plVar6;
  size_type *psVar7;
  Symbol symbol;
  Symbol existing_symbol;
  string local_c8;
  Symbol local_a8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  Message *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  symbol.field_1.package_file_descriptor = file;
  symbol._0_8_ = 8;
  bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,name,symbol);
  if (bVar1) {
    lVar2 = std::__cxx11::string::rfind((char)name,0x2e);
    if (lVar2 == -1) {
      ValidateSymbolName(this,name,name,proto);
      return;
    }
    this_00 = this->tables_;
    local_78 = proto;
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)name);
    name_00 = DescriptorPool::Tables::AllocateString(this_00,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    proto_00 = local_78;
    AddPackage(this,name_00,local_78,file);
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)name);
    ValidateSymbolName(this,&local_c8,name,proto_00);
    local_50.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return;
    }
  }
  else {
    local_c8._M_dataplus._M_p = (name->_M_dataplus)._M_p;
    cVar3 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->tables_->symbols_by_name_,(key_type *)&local_c8);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      local_a8.type = NULL_SYMBOL;
      local_a8.field_1.descriptor = (Descriptor *)0x0;
    }
    else {
      local_a8.type =
           *(Type *)((long)cVar3.
                           super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                           ._M_cur + 0x10);
      local_a8.field_1 =
           *(anon_union_8_8_13f84498_for_Symbol_2 *)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                   ._M_cur + 0x18);
      if (local_a8.type == PACKAGE) {
        return;
      }
    }
    std::operator+(&local_50,"\"",name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar4[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar4;
    }
    local_90 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pFVar5 = Symbol::GetFile(&local_a8);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_98,**(ulong **)pFVar5);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c8.field_2._M_allocated_capacity = *psVar7;
      local_c8.field_2._8_8_ = plVar4[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar7;
      local_c8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    AddError(this,name,proto,NAME,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(
    const string& name, const Message& proto, const FileDescriptor* file) {
  if (tables_->AddSymbol(name, Symbol(file))) {
    // Success.  Also add parent package, if any.
    string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      string* parent_name = tables_->AllocateString(name.substr(0, dot_pos));
      AddPackage(*parent_name, proto, file);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else {
    Symbol existing_symbol = tables_->FindSymbol(name);
    // It's OK to redefine a package.
    if (existing_symbol.type != Symbol::PACKAGE) {
      // Symbol seems to have been defined in a different file.
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + name + "\" is already defined (as something other than "
               "a package) in file \"" + existing_symbol.GetFile()->name() +
               "\".");
    }
  }
}